

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer
          (basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *this)

{
  wchar_t *pwVar1;
  
  (this->super_buffer<wchar_t>)._vptr_buffer = (_func_int **)&PTR_grow_001eac58;
  pwVar1 = (this->super_buffer<wchar_t>).ptr_;
  if (pwVar1 != this->store_) {
    operator_delete(pwVar1,(this->super_buffer<wchar_t>).capacity_ << 2);
  }
  operator_delete(this,0x7f0);
  return;
}

Assistant:

~basic_memory_buffer() FMT_OVERRIDE { deallocate(); }